

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O3

void __thiscall HashTbl::Grow(HashTbl *this)

{
  uint bucketCount;
  uint32 uVar1;
  Ident *pIVar2;
  code *pcVar3;
  Ident *pIVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  HashTbl *buckets;
  ulong uVar8;
  uint uVar9;
  HashTbl *this_00;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar14;
  
  uVar1 = this->m_luMask;
  iVar13 = uVar1 * 4;
  bucketCount = iVar13 + 4;
  if (POPCOUNT(bucketCount) != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x42,"(n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1)))",
                       "n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1))");
    if (!bVar5) goto LAB_00e605e7;
    *puVar7 = 0;
  }
  uVar9 = uVar1 + 1;
  if ((-1 < (int)(uVar9 * 0x20) && bucketCount < 0x20000000) &&
     (buckets = (HashTbl *)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,uVar9 * 0x20),
     buckets != (HashTbl *)0x0)) {
    uVar10 = iVar13 + 3;
    this_00 = buckets;
    memset(buckets,0,(ulong)(uVar9 * 0x20));
    if (uVar9 != 0) {
      uVar8 = 0;
      do {
        pIVar4 = this->m_prgpidName[uVar8];
        while (pIVar4 != (Ident *)0x0) {
          pIVar2 = pIVar4->m_pidNext;
          this_00 = (HashTbl *)(ulong)(pIVar4->m_luHash & uVar10);
          pIVar4->m_pidNext = buckets->m_rpid[(long)&this_00[-1].stats];
          buckets->m_rpid[(long)&this_00[-1].stats] = pIVar4;
          pIVar4 = pIVar2;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar9);
    }
    uVar6 = CountAndVerifyItems(this_00,(IdentPtr *)buckets,bucketCount,uVar10);
    if (uVar6 != this->m_luCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                         ,0x60,
                         "(CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount)",
                         "CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount");
      if (!bVar5) {
LAB_00e605e7:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    this->m_prgpidName = (Ident **)buckets;
    this->m_luMask = uVar10;
    if (this->stats != (DictionaryStats *)0x0) {
      if (bucketCount == 0) {
        uVar10 = 0;
      }
      else {
        uVar8 = 0;
        auVar12 = (undefined1  [16])0x0;
        do {
          lVar14 = -(ulong)((buckets->m_rpid + (uVar8 - 8))[1] == (IdentPtr)0x0);
          iVar13 = (int)lVar14;
          auVar11._0_4_ = auVar12._0_4_ + (uint)(buckets->m_rpid[uVar8 - 8] == (IdentPtr)0x0);
          auVar11._4_4_ = auVar12._4_4_ - iVar13;
          auVar11._8_4_ = auVar12._8_4_ - iVar13;
          auVar11._12_4_ = auVar12._12_4_ - (int)((ulong)lVar14 >> 0x20);
          uVar8 = uVar8 + 2;
          auVar12 = auVar11;
        } while (bucketCount != uVar8);
        auVar12 = phaddd(auVar11,auVar11);
        uVar10 = auVar12._0_4_;
      }
      DictionaryStats::Resize(this->stats,bucketCount,uVar10);
      return;
    }
  }
  return;
}

Assistant:

void HashTbl::Grow()
{
    // Grow the bucket size by grow factor
    // Has the side-effect of inverting the order the pids appear in their respective buckets.
    uint cidHash = m_luMask + 1;
    uint n_cidHash = cidHash * GrowFactor;
    Assert(n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1)));

    // Win8 730594 - Use intsafe function to check for overflow.
    uint cbTemp;
    if (FAILED(UIntMult(n_cidHash, sizeof(Ident *), &cbTemp)) || cbTemp > LONG_MAX)
        // It is fine to exit early here, we will just have a potentially densely populated hash table
        return;
    int32 cb = cbTemp;
    uint n_luMask = n_cidHash - 1;

    IdentPtr *n_prgpidName = (IdentPtr *)m_noReleaseAllocator.Alloc(cb);
    if (n_prgpidName == nullptr)
        // It is fine to exit early here, we will just have a potentially densely populated hash table
        return;

    // Clear the array
    memset(n_prgpidName, 0, cb);

    // Place each entry its new bucket.
    for (uint i = 0; i < cidHash; i++)
    {
        for (IdentPtr pid = m_prgpidName[i], next = pid ? pid->m_pidNext : nullptr; pid; pid = next, next = pid ? pid->m_pidNext : nullptr)
        {
            uint32 luHash = pid->m_luHash;
            uint32 luIndex = luHash & n_luMask;
            pid->m_pidNext = n_prgpidName[luIndex];
            n_prgpidName[luIndex] = pid;
        }
    }

    Assert(CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount);

    // Update the table fields.
    m_prgpidName = n_prgpidName;
    m_luMask= n_luMask;

#if PROFILE_DICTIONARY
    if(stats)
    {
        int emptyBuckets = 0;
        for (uint i = 0; i < n_cidHash; i++)
        {
            if(m_prgpidName[i] == nullptr)
            {
                emptyBuckets++;
            }
        }
        stats->Resize(n_cidHash, emptyBuckets);
    }
#endif
}